

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::CheckAlign
          (SharedValidator *this,Location *loc,Address alignment,Address natural_alignment)

{
  bool bVar1;
  Address natural_alignment_local;
  Address alignment_local;
  Location *loc_local;
  SharedValidator *this_local;
  
  bVar1 = is_power_of_two((uint32_t)alignment);
  if (bVar1) {
    if (natural_alignment < alignment) {
      PrintError(this,loc,"alignment must not be larger than natural alignment (%lu)",
                 natural_alignment);
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  else {
    PrintError(this,loc,"alignment (%lu) must be a power of 2",alignment);
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::CheckAlign(const Location& loc,
                                   Address alignment,
                                   Address natural_alignment) {
  if (!is_power_of_two(alignment)) {
    PrintError(loc, "alignment (%" PRIaddress ") must be a power of 2",
               alignment);
    return Result::Error;
  }
  if (alignment > natural_alignment) {
    PrintError(
        loc,
        "alignment must not be larger than natural alignment (%" PRIaddress ")",
        natural_alignment);
    return Result::Error;
  }
  return Result::Ok;
}